

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::on_udp_writeable
          (session_impl *this,weak_ptr<libtorrent::aux::session_udp_socket> *sock,error_code *ec)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  pointer psVar3;
  _Atomic_word _Var4;
  pointer psVar5;
  pointer psVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  if ((ec->failed_ != false) ||
     (this_00 = (sock->
                super___weak_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi, this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
  {
    return;
  }
  _Var4 = this_00->_M_use_count;
  do {
    if (_Var4 == 0) {
      return;
    }
    LOCK();
    iVar1 = this_00->_M_use_count;
    bVar9 = _Var4 == iVar1;
    if (bVar9) {
      this_00->_M_use_count = _Var4 + 1;
      iVar1 = _Var4;
    }
    _Var4 = iVar1;
    UNLOCK();
  } while (!bVar9);
  peVar2 = (sock->super___weak_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (peVar2 == (element_type *)0x0 || this_00->_M_use_count == 0) goto LAB_002c2201;
  peVar2->write_blocked = false;
  psVar6 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)psVar3 - (long)psVar6;
  if (0 < (long)uVar8 >> 6) {
    psVar5 = (pointer)((long)&(psVar6->
                              super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + (uVar8 & 0xffffffffffffffc0));
    lVar7 = ((long)uVar8 >> 6) + 1;
    psVar6 = psVar6 + 2;
    do {
      if (((psVar6[-2].
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) {
        psVar6 = psVar6 + -2;
        goto LAB_002c21de;
      }
      if (((psVar6[-1].
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) {
        psVar6 = psVar6 + -1;
        goto LAB_002c21de;
      }
      if ((((psVar6->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) goto LAB_002c21de;
      if (((psVar6[1].
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == peVar2) {
        psVar6 = psVar6 + 1;
        goto LAB_002c21de;
      }
      lVar7 = lVar7 + -1;
      psVar6 = psVar6 + 4;
    } while (1 < lVar7);
    uVar8 = (long)psVar3 - (long)psVar5;
    psVar6 = psVar5;
  }
  lVar7 = (long)uVar8 >> 4;
  if (lVar7 == 1) {
LAB_002c21bb:
    if ((((psVar6->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
         ._M_ptr)->udp_sock).
        super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != peVar2) {
      psVar6 = psVar3;
    }
LAB_002c21de:
    if ((psVar6 == psVar3) ||
       (lVar7 = 0x1bf0,
       ((psVar6->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->ssl != ssl)) goto LAB_002c21f4;
  }
  else {
    if (lVar7 == 2) {
LAB_002c21ab:
      if ((((psVar6->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != peVar2) {
        psVar6 = psVar6 + 1;
        goto LAB_002c21bb;
      }
      goto LAB_002c21de;
    }
    if (lVar7 == 3) {
      if ((((psVar6->
            super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->udp_sock).
          super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != peVar2) {
        psVar6 = psVar6 + 1;
        goto LAB_002c21ab;
      }
      goto LAB_002c21de;
    }
LAB_002c21f4:
    lVar7 = 0x1a78;
  }
  aux::utp_socket_manager::writable
            ((utp_socket_manager *)
             ((long)&(this->super_session_interface).super_session_logger._vptr_session_logger +
             lVar7));
LAB_002c2201:
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void session_impl::on_udp_writeable(std::weak_ptr<session_udp_socket> sock, error_code const& ec)
	{
		COMPLETE_ASYNC("session_impl::on_udp_writeable");
		if (ec) return;

		auto s = sock.lock();
		if (!s) return;

		s->write_blocked = false;

#ifdef TORRENT_SSL_PEERS
		auto i = std::find_if(
			m_listen_sockets.begin(), m_listen_sockets.end()
			, [&s] (std::shared_ptr<listen_socket_t> const& ls) { return ls->udp_sock == s; });
#endif

		// notify the utp socket manager it can start sending on the socket again
		struct utp_socket_manager& mgr =
#ifdef TORRENT_SSL_PEERS
			(i != m_listen_sockets.end() && (*i)->ssl == transport::ssl) ? m_ssl_utp_socket_manager :
#endif
			m_utp_socket_manager;

		mgr.writable();
	}